

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

_Bool roaring64_bitmap_intersect_with_range(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  _Bool _Var1;
  ulong uVar2;
  bool bVar3;
  uint16_t low16;
  roaring64_iterator_t it;
  uint16_t local_e2;
  roaring64_iterator_t local_e0;
  
  if (min < max) {
    local_e0.r = r;
    art_init_iterator(&local_e0.art_it,&r->art,true);
    bVar3 = local_e0.art_it.value == (ulong *)0x0;
    local_e0.has_value = !bVar3;
    if (bVar3) {
      local_e0.saturated_forward = true;
    }
    else {
      uVar2 = (ulong)CONCAT24(local_e0.art_it.key._4_2_,local_e0.art_it.key._0_4_);
      uVar2 = ((ulong)(ushort)local_e0.art_it.key._4_2_ << 0x20 & 0xff0000000000) >> 0x18 |
              ((ulong)(ushort)local_e0.art_it.key._4_2_ << 0x20 & 0xff00000000) >> 8 |
              (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
              uVar2 << 0x38;
      local_e2 = 0;
      local_e0.high48 = uVar2;
      local_e0.container_it =
           container_init_iterator
                     (r->containers[*local_e0.art_it.value >> 8],(uint8_t)*local_e0.art_it.value,
                      &local_e2);
      local_e0.value = local_e2 | uVar2;
    }
    local_e0.has_value = !bVar3;
    _Var1 = roaring64_iterator_move_equalorlarger(&local_e0,min);
    if ((_Var1) && (local_e0.has_value == true)) {
      _Var1 = local_e0.value < max;
    }
    else {
      _Var1 = false;
    }
    return _Var1;
  }
  return false;
}

Assistant:

bool roaring64_bitmap_intersect_with_range(const roaring64_bitmap_t *r,
                                           uint64_t min, uint64_t max) {
    if (min >= max) {
        return false;
    }
    roaring64_iterator_t it;
    roaring64_iterator_init_at(r, &it, /*first=*/true);
    if (!roaring64_iterator_move_equalorlarger(&it, min)) {
        return false;
    }
    return roaring64_iterator_has_value(&it) &&
           roaring64_iterator_value(&it) < max;
}